

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O3

bool __thiscall
draco::RAnsSymbolDecoder<8>::StartDecoding(RAnsSymbolDecoder<8> *this,DecoderBuffer *buffer)

{
  byte bVar1;
  bool bVar2;
  ulong in_RAX;
  long lVar3;
  uint8_t *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong local_18;
  
  if (buffer->bitstream_version_ < 0x200) {
    lVar3 = buffer->data_size_;
    lVar6 = buffer->pos_ + 8;
    if (lVar3 < lVar6) {
      return false;
    }
    local_18 = *(ulong *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar6;
  }
  else {
    local_18 = in_RAX;
    bVar2 = anon_unknown_52::DecodeVarintUnsigned<unsigned_long>(1,&local_18,buffer);
    if (!bVar2) {
      return false;
    }
    lVar3 = buffer->data_size_;
    lVar6 = buffer->pos_;
  }
  if (local_18 <= (ulong)(lVar3 - lVar6)) {
    puVar4 = (uint8_t *)(buffer->data_ + lVar6);
    buffer->pos_ = lVar6 + local_18;
    uVar5 = (uint)local_18;
    if (0 < (int)uVar5) {
      (this->ans_).ans_.buf = puVar4;
      uVar7 = uVar5 - 1;
      if (puVar4[uVar7] < 0x40) {
        (this->ans_).ans_.buf_offset = uVar7;
        uVar5 = puVar4[uVar7] & 0x3f;
      }
      else {
        bVar1 = puVar4[uVar7] >> 6;
        if (bVar1 == 2) {
          if (uVar5 < 3) {
            return false;
          }
          (this->ans_).ans_.buf_offset = uVar5 - 3;
          uVar5 = (*(ushort *)(puVar4 + ((ulong)(uVar5 & 0x7fffffff) - 2)) & 0x3fff) << 8 |
                  (uint)puVar4[(ulong)(uVar5 & 0x7fffffff) - 3];
        }
        else if (bVar1 == 1) {
          if (uVar5 == 1) {
            return false;
          }
          (this->ans_).ans_.buf_offset = uVar5 - 2;
          uVar5 = (puVar4[(ulong)(uVar5 & 0x7fffffff) - 1] & 0x3f) << 8 |
                  (uint)puVar4[(ulong)(uVar5 & 0x7fffffff) - 2];
        }
        else {
          (this->ans_).ans_.buf_offset = uVar5 - 4;
          uVar5 = *(uint *)(puVar4 + ((ulong)(uVar5 & 0x7fffffff) - 4)) & 0x3fffffff;
        }
      }
      (this->ans_).ans_.state = uVar5 + 0x4000;
      return uVar5 < 0x3fc000;
    }
  }
  return false;
}

Assistant:

bool RAnsSymbolDecoder<unique_symbols_bit_length_t>::StartDecoding(
    DecoderBuffer *buffer) {
  uint64_t bytes_encoded;
  // Decode the number of bytes encoded by the encoder.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!buffer->Decode(&bytes_encoded)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint<uint64_t>(&bytes_encoded, buffer)) {
      return false;
    }
  }
  if (bytes_encoded > static_cast<uint64_t>(buffer->remaining_size())) {
    return false;
  }
  const uint8_t *const data_head =
      reinterpret_cast<const uint8_t *>(buffer->data_head());
  // Advance the buffer past the rANS data.
  buffer->Advance(bytes_encoded);
  if (ans_.read_init(data_head, static_cast<int>(bytes_encoded)) != 0) {
    return false;
  }
  return true;
}